

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

void TryRunTics(void)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  AActor *listenactor;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  if (pauseext) {
    r_NoInterpolate = true;
  }
  else if ((!cl_capfps.Value) && (!r_NoInterpolate)) {
    bVar1 = false;
    entertic = (*I_GetTime)(false);
    goto LAB_0038960b;
  }
  entertic = (*I_WaitForTic)(oldentertics);
  bVar1 = true;
LAB_0038960b:
  uVar11 = entertic - oldentertics;
  oldentertics = entertic;
  NetUpdate();
  if (pauseext != false) {
    return;
  }
  uVar5 = 0;
  uVar2 = doomcom.numnodes;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar10 = 0x7fffffff;
  piVar8 = nettics;
  for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    if ((nodeingame[uVar5] == true) && (*piVar8 < iVar10)) {
      iVar10 = *piVar8;
    }
    piVar8 = piVar8 + 1;
  }
  iVar3 = gametic;
  if (ticdup != 1) {
    iVar3 = gametic / ticdup;
  }
  uVar7 = iVar10 - iVar3;
  uVar4 = uVar7;
  if ((int)uVar11 < (int)uVar7) {
    uVar4 = uVar11;
  }
  if ((int)uVar11 < (int)(uVar7 - 1)) {
    uVar4 = uVar11 + 1;
  }
  if (bVar1 || uVar4 != 0) {
    uVar5 = 1;
    if (1 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
    }
    if (debugfile != (FILE *)0x0) {
      fprintf((FILE *)debugfile,"=======real: %i  avail: %i  game: %i\n",(ulong)uVar11,(ulong)uVar7,
              uVar5);
    }
    do {
      if (gametic + (int)uVar5 <= iVar10) {
        hadlate = false;
        for (lVar6 = 0xf4; lVar6 != 0x15f4; lVar6 = lVar6 + 0x2a0) {
          *(undefined1 *)((long)&players + lVar6) = 0;
        }
        lastglobalrecvtime = (*I_GetTime)(false);
        P_UnPredictPlayer();
        while (iVar3 = (int)uVar5, uVar5 = (ulong)(iVar3 - 1), iVar3 != 0) {
          if (iVar10 < gametic) {
            I_Error("gametic>lowtic");
          }
          if (advancedemo == true) {
            D_DoAdvanceDemo();
          }
          if (debugfile != (FILE *)0x0) {
            fprintf((FILE *)debugfile,"run tic %d\n",(ulong)(uint)gametic);
          }
          C_Ticker();
          M_Ticker();
          (*I_GetTime)(true);
          G_Ticker();
          gametic = gametic + 1;
          NetUpdate();
        }
        P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
        listenactor = GC::ReadBarrier<AActor>
                                ((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
        S_UpdateSounds(listenactor);
        return;
      }
      NetUpdate();
      uVar2 = doomcom.numnodes;
      if ((short)uVar2 < 1) {
        uVar2 = 0;
      }
      iVar10 = 0x7fffffff;
      piVar8 = nettics;
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        if ((nodeingame[uVar9] == true) && (*piVar8 < iVar10)) {
          iVar10 = *piVar8;
        }
        piVar8 = piVar8 + 1;
      }
      iVar10 = iVar10 * ticdup;
      if (iVar10 < gametic) {
        I_Error("TryRunTics: lowtic < gametic");
      }
      Net_CheckLastReceived((int)uVar5);
      iVar3 = (*I_GetTime)(false);
    } while (iVar3 <= entertic);
  }
  else {
    Net_CheckLastReceived(0);
    if ((int)uVar11 < 1) {
      return;
    }
  }
  C_Ticker();
  M_Ticker();
  P_UnPredictPlayer();
  P_PredictPlayer((player_t *)(&players + (long)consoleplayer * 0x54));
  return;
}

Assistant:

void TryRunTics (void)
{
	int 		i;
	int 		lowtic;
	int 		realtics;
	int 		availabletics;
	int 		counts;
	int 		numplaying;

	// If paused, do not eat more CPU time than we need, because it
	// will all be wasted anyway.
	if (pauseext) 
		r_NoInterpolate = true;
	bool doWait = cl_capfps || r_NoInterpolate /*|| netgame*/;

	// get real tics
	if (doWait)
	{
		entertic = I_WaitForTic (oldentertics);
	}
	else
	{
		entertic = I_GetTime (false);
	}
	realtics = entertic - oldentertics;
	oldentertics = entertic;

	// get available tics
	NetUpdate ();

	if (pauseext)
		return;

	lowtic = INT_MAX;
	numplaying = 0;
	for (i = 0; i < doomcom.numnodes; i++)
	{
		if (nodeingame[i])
		{
			numplaying++;
			if (nettics[i] < lowtic)
				lowtic = nettics[i];
		}
	}

	if (ticdup == 1)
	{
		availabletics = lowtic - gametic;
	}
	else
	{
		availabletics = lowtic - gametic / ticdup;
	}

	// decide how many tics to run
	if (realtics < availabletics-1)
		counts = realtics+1;
	else if (realtics < availabletics)
		counts = realtics;
	else
		counts = availabletics;
	
	// Uncapped framerate needs seprate checks
	if (counts == 0 && !doWait)
	{
		// Check possible stall conditions
		Net_CheckLastReceived(counts);
		if (realtics >= 1)
		{
			C_Ticker();
			M_Ticker();
			// Repredict the player for new buffered movement
			P_UnPredictPlayer();
			P_PredictPlayer(&players[consoleplayer]);
		}
		return;
	}

	if (counts < 1)
		counts = 1;

	if (debugfile)
		fprintf (debugfile,
				 "=======real: %i  avail: %i  game: %i\n",
				 realtics, availabletics, counts);

	// wait for new tics if needed
	while (lowtic < gametic + counts)
	{
		NetUpdate ();
		lowtic = INT_MAX;

		for (i = 0; i < doomcom.numnodes; i++)
			if (nodeingame[i] && nettics[i] < lowtic)
				lowtic = nettics[i];

		lowtic = lowtic * ticdup;

		if (lowtic < gametic)
			I_Error ("TryRunTics: lowtic < gametic");

		// Check possible stall conditions
		Net_CheckLastReceived (counts);

		// don't stay in here forever -- give the menu a chance to work
		if (I_GetTime (false) - entertic >= 1)
		{
			C_Ticker ();
			M_Ticker ();
			// Repredict the player for new buffered movement
			P_UnPredictPlayer();
			P_PredictPlayer(&players[consoleplayer]);
			return;
		}
	}

	//Tic lowtic is high enough to process this gametic. Clear all possible waiting info
	hadlate = false;
	for (i = 0; i < MAXPLAYERS; i++)
		players[i].waiting = false;
	lastglobalrecvtime = I_GetTime (false); //Update the last time the game tic'd over

	// run the count tics
	if (counts > 0)
	{
		P_UnPredictPlayer();
		while (counts--)
		{
			if (gametic > lowtic)
			{
				I_Error ("gametic>lowtic");
			}
			if (advancedemo)
			{
				D_DoAdvanceDemo ();
			}
			if (debugfile) fprintf (debugfile, "run tic %d\n", gametic);
			C_Ticker ();
			M_Ticker ();
			I_GetTime (true);
			G_Ticker();
			gametic++;

			NetUpdate ();	// check for new console commands
		}
		P_PredictPlayer(&players[consoleplayer]);
		S_UpdateSounds (players[consoleplayer].camera);	// move positional sounds
	}
}